

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Acceptor.cpp
# Opt level: O2

void __thiscall higan::Acceptor::Acceptor(Acceptor *this,EventLoop *loop,InetAddress *address)

{
  Socket *this_00;
  EventLoop *loop_00;
  int fd;
  _Bind<void_(higan::Acceptor::*(higan::Acceptor_*))()> local_60;
  string local_48;
  
  this->loop_ = loop;
  this_00 = &this->listening_socket_;
  Socket::Socket(this_00,address);
  loop_00 = this->loop_;
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_48,"acceptor",(allocator<char> *)&local_60);
  fd = Socket::GetFd(this_00);
  Channel::Channel(&this->channel_,loop_00,&local_48,fd);
  std::__cxx11::string::~string((string *)&local_48);
  (this->newconnection_callback_).super__Function_base._M_manager = (_Manager_type)0x0;
  (this->newconnection_callback_)._M_invoker = (_Invoker_type)0x0;
  *(undefined8 *)&(this->newconnection_callback_).super__Function_base._M_functor = 0;
  *(undefined8 *)((long)&(this->newconnection_callback_).super__Function_base._M_functor + 8) = 0;
  Socket::SetReuseAddr(this_00);
  Socket::SetReusePort(this_00);
  Socket::Bind(this_00);
  local_60._M_f = (offset_in_Acceptor_to_subr)OnNewConnectionInternal;
  local_60._8_8_ = 0;
  local_60._M_bound_args.super__Tuple_impl<0UL,_higan::Acceptor_*>.
  super__Head_base<0UL,_higan::Acceptor_*,_false>._M_head_impl =
       (_Tuple_impl<0UL,_higan::Acceptor_*>)(_Tuple_impl<0UL,_higan::Acceptor_*>)this;
  std::function<void()>::function<std::_Bind<void(higan::Acceptor::*(higan::Acceptor*))()>,void>
            ((function<void()> *)&local_48,&local_60);
  Channel::SetReadableCallback(&this->channel_,(ChannelCallback *)&local_48);
  std::_Function_base::~_Function_base((_Function_base *)&local_48);
  return;
}

Assistant:

Acceptor::Acceptor(EventLoop* loop, const InetAddress& address):
		loop_(loop),
		listening_socket_(address),
		channel_(loop_, "acceptor", listening_socket_.GetFd())
{
	listening_socket_.SetReuseAddr();
	listening_socket_.SetReusePort();
	listening_socket_.Bind();

	channel_.SetReadableCallback(std::bind(&Acceptor::OnNewConnectionInternal, this));
}